

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionTaperedTimoshenko.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric::ComputeConsistentInertiaMatrix
          (ChBeamSectionTaperedTimoshenkoAdvancedGeneric *this,ChMatrixNM<double,_12,_12> *M)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  Scalar SVar4;
  element_type *peVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  Scalar *pSVar9;
  int i;
  long col;
  int j;
  long row;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  undefined8 uVar54;
  double dVar55;
  ulong uVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined1 auVar64 [16];
  double dVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  double dVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  
  Eigen::DenseBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_> *)M);
  dVar49 = (double)(**(code **)((long)(((this->sectionA).
                                        super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                      super_ChBeamSectionEulerAdvancedGeneric.
                                      super_ChBeamSectionEuler.super_ChBeamSection.
                                      _vptr_ChBeamSection + 0x58))();
  dVar50 = (double)(**(code **)((long)(((this->sectionA).
                                        super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                      super_ChBeamSectionEulerAdvancedGeneric.
                                      super_ChBeamSectionEuler.super_ChBeamSection.
                                      _vptr_ChBeamSection + 0x60))();
  dVar51 = (double)(**(code **)((long)(((this->sectionA).
                                        super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                      super_ChBeamSectionEulerAdvancedGeneric.
                                      super_ChBeamSectionEuler.super_ChBeamSection.
                                      _vptr_ChBeamSection + 0x178))();
  dVar52 = (double)(**(code **)((long)(((this->sectionA).
                                        super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                      super_ChBeamSectionEulerAdvancedGeneric.
                                      super_ChBeamSectionEuler.super_ChBeamSection.
                                      _vptr_ChBeamSection + 0x180))();
  dVar53 = (double)(**(code **)((long)(((this->sectionA).
                                        super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                      super_ChBeamSectionEulerAdvancedGeneric.
                                      super_ChBeamSectionEuler.super_ChBeamSection.
                                      _vptr_ChBeamSection + 0x188))();
  uVar54 = (**(code **)((long)(((this->sectionA).
                                super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                              super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                              super_ChBeamSection._vptr_ChBeamSection + 400))();
  dVar55 = (double)(**(code **)((long)(((this->sectionA).
                                        super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                      super_ChBeamSectionEulerAdvancedGeneric.
                                      super_ChBeamSectionEuler.super_ChBeamSection.
                                      _vptr_ChBeamSection + 0x198))();
  uVar56 = (**(code **)((long)(((this->sectionB).
                                super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                              super_ChBeamSectionEulerAdvancedGeneric.super_ChBeamSectionEuler.
                              super_ChBeamSection._vptr_ChBeamSection + 0x58))();
  dVar57 = (double)(**(code **)((long)(((this->sectionB).
                                        super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                      super_ChBeamSectionEulerAdvancedGeneric.
                                      super_ChBeamSectionEuler.super_ChBeamSection.
                                      _vptr_ChBeamSection + 0x60))();
  dVar58 = (double)(**(code **)((long)(((this->sectionB).
                                        super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                      super_ChBeamSectionEulerAdvancedGeneric.
                                      super_ChBeamSectionEuler.super_ChBeamSection.
                                      _vptr_ChBeamSection + 0x178))();
  dVar59 = (double)(**(code **)((long)(((this->sectionB).
                                        super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                      super_ChBeamSectionEulerAdvancedGeneric.
                                      super_ChBeamSectionEuler.super_ChBeamSection.
                                      _vptr_ChBeamSection + 0x180))();
  dVar60 = (double)(**(code **)((long)(((this->sectionB).
                                        super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                      super_ChBeamSectionEulerAdvancedGeneric.
                                      super_ChBeamSectionEuler.super_ChBeamSection.
                                      _vptr_ChBeamSection + 0x188))();
  dVar61 = (double)(**(code **)((long)(((this->sectionB).
                                        super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                      super_ChBeamSectionEulerAdvancedGeneric.
                                      super_ChBeamSectionEuler.super_ChBeamSection.
                                      _vptr_ChBeamSection + 400))();
  dVar62 = (double)(**(code **)((long)(((this->sectionB).
                                        super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->super_ChBeamSectionRayleighAdvancedGeneric).
                                      super_ChBeamSectionEulerAdvancedGeneric.
                                      super_ChBeamSectionEuler.super_ChBeamSection.
                                      _vptr_ChBeamSection + 0x198))();
  dVar2 = this->length;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = dVar2;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = dVar51;
  peVar5 = (this->avg_sec_par).
           super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar49;
  col = 0;
  auVar10 = vmulsd_avx512f(auVar103,ZEXT816(0x4014000000000000));
  auVar48._0_8_ = peVar5->phimy;
  auVar48._8_8_ = peVar5->phimz;
  dVar3 = peVar5->phimz;
  auVar111._8_8_ = 0;
  auVar111._0_8_ = dVar3;
  auVar110._8_8_ = 0;
  auVar110._0_8_ = peVar5->mu;
  auVar11 = vmulsd_avx512f(auVar18,auVar103);
  auVar116._8_8_ = 0;
  auVar116._0_8_ = uVar56;
  auVar12 = vmulsd_avx512f(auVar116,auVar103);
  auVar13 = vfmadd213sd_avx512f(ZEXT816(0x3fe0000000000000),auVar111,ZEXT816(0xbfb999999999999a));
  auVar14 = vmulsd_avx512f(auVar103,auVar103);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar51 * 6.0;
  auVar15 = vdivsd_avx512f(auVar29,auVar10);
  auVar118._8_8_ = 0;
  auVar118._0_8_ = dVar58;
  auVar16 = vmulsd_avx512f(auVar118,ZEXT816(0x4018000000000000));
  auVar17 = vmulsd_avx512f(auVar18,auVar14);
  auVar18 = vmulsd_avx512f(auVar116,auVar14);
  auVar19 = vmulsd_avx512f(auVar111,auVar111);
  auVar20 = vmulsd_avx512f(auVar103,auVar110);
  auVar16 = vdivsd_avx512f(auVar16,auVar10);
  auVar28._8_8_ = 0x3ff0000000000000;
  auVar28._0_8_ = 0x3ff0000000000000;
  auVar21._0_8_ = (double)auVar48._0_8_ + 1.0;
  auVar21._8_8_ = (double)auVar48._8_8_ + 1.0;
  auVar21 = vdivpd_avx512vl(auVar28,auVar21);
  auVar69 = ZEXT816(0x3fd5555555555555);
  auVar97._8_8_ = 0;
  auVar97._0_8_ = dVar3 * 0.7;
  auVar22 = vfmadd231sd_avx512f(auVar97,auVar19,auVar69);
  auVar23 = vaddsd_avx512f(auVar22,ZEXT816(0x3fd7c57c57c57c58));
  auVar24 = vshufpd_avx512vl(auVar21,auVar21,1);
  dVar63 = auVar24._0_8_;
  dVar68 = dVar63 * dVar63;
  auVar22 = vmulsd_avx512f(auVar11,auVar23);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = dVar68;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = auVar22._0_8_ * dVar68;
  auVar22 = vfmadd231sd_fma(auVar66,auVar47,auVar15);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar68 * auVar12._0_8_ * auVar23._0_8_;
  auVar23 = vfmadd231sd_fma(auVar27,auVar47,auVar16);
  auVar120._8_8_ = 0;
  auVar120._0_8_ = peVar5->Jyy;
  auVar15 = vmulsd_avx512f(auVar120,ZEXT816(0xc018000000000000));
  auVar93._8_8_ = 0;
  auVar93._0_8_ = dVar3 * 0.3;
  auVar16 = vfmadd231sd_avx512f(auVar93,auVar19,ZEXT816(0x3fc5555555555555));
  auVar15 = vdivsd_avx512f(auVar15,auVar10);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = auVar16._0_8_ + 0.12857142857142856;
  auVar16 = vmulsd_avx512f(auVar20,auVar94);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = auVar15._0_8_ * dVar68;
  auVar8 = vfmadd231sd_fma(auVar30,auVar47,auVar16);
  auVar15 = vmulsd_avx512f(auVar75,auVar13);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = dVar3 * 0.09166666666666666;
  auVar16 = vfmadd231sd_avx512f(auVar80,auVar19,ZEXT816(0x3fa5555555555555));
  auVar81._8_8_ = 0;
  auVar81._0_8_ = auVar16._0_8_ + 0.05238095238095238;
  auVar16 = vmulsd_avx512f(auVar17,auVar81);
  auVar25 = vmulsd_avx512f(auVar18,auVar81);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = auVar15._0_8_ * dVar68;
  auVar64 = vfmsub231sd_fma(auVar33,auVar47,auVar16);
  auVar119._8_8_ = 0;
  auVar119._0_8_ = dVar58;
  auVar15 = vmulsd_avx512f(auVar119,auVar13);
  auVar26 = vmulsd_avx512f(auVar14,auVar110);
  auVar16 = vmulsd_avx512f(auVar120,auVar13);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar68;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = auVar15._0_8_ * dVar68;
  auVar66 = vfmsub231sd_fma(auVar34,auVar31,auVar25);
  auVar15 = vmulsd_avx512f(auVar103,auVar14);
  auVar117._8_8_ = 0;
  auVar117._0_8_ = uVar56;
  auVar27 = vmulsd_avx512f(auVar117,auVar15);
  dVar6 = peVar5->mu * auVar15._0_8_;
  auVar28 = vmulsd_avx512f(auVar111,ZEXT816(0x3fc5555555555555));
  auVar25 = vfmadd213sd_avx512f(auVar69,auVar19,auVar28);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = dVar3 * 0.075;
  auVar29 = vfmadd231sd_avx512f(auVar82,auVar19,ZEXT816(0x3fa5555555555555));
  dVar7 = dVar2 * (auVar25._0_8_ + 0.13333333333333333);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = dVar52;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = auVar29._0_8_ + 0.030952380952380953;
  auVar25 = vmulsd_avx512f(auVar26,auVar83);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = auVar16._0_8_ * dVar68;
  auVar25 = vfmadd231sd_fma(auVar35,auVar31,auVar25);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = dVar3 * 0.016666666666666666;
  auVar16 = vfmadd231sd_avx512f(auVar84,auVar19,ZEXT816(0x3f81111111111111));
  dVar65 = auVar16._0_8_ + 0.009523809523809525;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = dVar49 * auVar15._0_8_;
  auVar112._8_8_ = 0;
  auVar112._0_8_ = dVar65;
  auVar15 = vmulsd_avx512f(auVar106,auVar112);
  dVar49 = (double)auVar48._0_8_ * (double)auVar48._0_8_;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar7 * dVar51 * dVar68;
  auVar30 = vfmadd231sd_avx512f(auVar36,auVar31,auVar15);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar7 * dVar58 * dVar68;
  auVar113._8_8_ = 0;
  auVar113._0_8_ = dVar65 * auVar27._0_8_;
  auVar29 = vfmadd231sd_fma(auVar37,auVar31,auVar113);
  auVar15 = vfmadd213sd_avx512f(auVar19,ZEXT816(0xbfc5555555555555),auVar28);
  auVar15 = vaddsd_avx512f(auVar15,ZEXT816(0x3fa1111111111111));
  auVar98._8_8_ = 0;
  auVar98._0_8_ = dVar6;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = dVar2 * auVar15._0_8_;
  auVar121._8_8_ = 0;
  auVar121._0_8_ = peVar5->Jyy;
  auVar15 = vmulsd_avx512f(auVar121,auVar95);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar68 * auVar15._0_8_;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = dVar6 * (auVar16._0_8_ + 0.007142857142857143);
  auVar19 = vfmadd231sd_fma(auVar38,auVar31,auVar85);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = dVar52 * 6.0;
  auVar16 = vdivsd_avx512f(auVar86,auVar10);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = (double)auVar48._0_8_ * 0.7;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar49;
  auVar15 = vfmadd231sd_fma(auVar32,auVar40,auVar69);
  auVar15 = vaddsd_avx512f(auVar15,ZEXT816(0x3fd7c57c57c57c58));
  auVar31 = vmulsd_avx512f(auVar21,auVar21);
  auVar69._8_8_ = extraout_XMM0_Qb;
  auVar69._0_8_ = uVar54;
  auVar28 = vmulsd_avx512f(auVar11,auVar15);
  auVar15 = vmulsd_avx512f(auVar12,auVar15);
  auVar28 = vmulsd_avx512f(auVar31,auVar28);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = dVar59;
  auVar32 = vfmadd231sd_avx512f(auVar28,auVar31,auVar16);
  auVar15 = vmulsd_avx512f(auVar31,auVar15);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = dVar59 * 6.0;
  auVar16 = vdivsd_avx512f(auVar87,auVar10);
  auVar28 = vfmadd231sd_fma(auVar15,auVar31,auVar16);
  dVar65 = peVar5->Jzz;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = dVar65;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = (double)auVar48._0_8_ * 0.3;
  auVar15 = vfmadd231sd_avx512f(auVar88,auVar40,ZEXT816(0x3fc5555555555555));
  auVar99._8_8_ = 0;
  auVar99._0_8_ = dVar65 * -6.0;
  auVar16 = vdivsd_avx512f(auVar99,auVar10);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = auVar15._0_8_ + 0.12857142857142856;
  auVar15 = vmulsd_avx512f(auVar20,auVar89);
  dVar68 = auVar31._0_8_;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = auVar16._0_8_ * dVar68;
  auVar47 = vfmadd231sd_fma(auVar104,auVar31,auVar15);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar49;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = (double)auVar48._0_8_ * 0.09166666666666666;
  auVar72 = ZEXT816(0x3fa5555555555555);
  auVar15 = vfmadd231sd_avx512f(auVar90,auVar41,auVar72);
  auVar15 = vaddsd_avx512f(auVar15,ZEXT816(0x3faad1ad1ad1ad1b));
  auVar33 = vmulsd_avx512f(auVar69,ZEXT816(0x3fe0000000000000));
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar55;
  auVar34 = vmulsd_avx512f(ZEXT816(0x3fe0000000000000),auVar16);
  auVar35 = vfmadd213sd_avx512f(ZEXT816(0x3fe0000000000000),auVar48,ZEXT816(0xbfb999999999999a));
  auVar16 = vmulsd_avx512f(auVar17,auVar15);
  auVar17 = vmulsd_avx512f(auVar92,auVar35);
  auVar36 = vmulsd_avx512f(auVar48,ZEXT816(0x3fc5555555555555));
  auVar100._8_8_ = 0;
  auVar100._0_8_ = auVar17._0_8_ * dVar68;
  auVar37 = vfmsub231sd_avx512f(auVar100,auVar31,auVar16);
  auVar16 = vmulsd_avx512f(auVar18,auVar15);
  auVar17 = vmulsd_avx512f(auVar96,auVar35);
  auVar15 = vfmadd213sd_fma(ZEXT816(0xbfc5555555555555),auVar41,auVar36);
  auVar17 = vmulsd_avx512f(auVar17,auVar31);
  auVar38 = vfmsub231sd_avx512f(auVar17,auVar31,auVar16);
  auVar16 = vmulsd_avx512f(auVar48,ZEXT816(0x3fb3333333333333));
  auVar17 = vfmadd213sd_avx512f(ZEXT816(0x3fd5555555555555),auVar41,auVar36);
  auVar17 = vaddsd_avx512f(auVar17,ZEXT816(0x3fc1111111111111));
  auVar16 = vfmadd231sd_avx512f(auVar16,auVar41,auVar72);
  auVar16 = vaddsd_avx512f(auVar16,ZEXT816(0x3f9fb1fb1fb1fb20));
  auVar18 = vmulsd_avx512f(auVar103,auVar17);
  auVar17 = vmulsd_avx512f(auVar92,auVar18);
  auVar16 = vmulsd_avx512f(auVar26,auVar16);
  auVar26 = vmulsd_avx512f(auVar76,auVar35);
  auVar17 = vmulsd_avx512f(auVar31,auVar17);
  auVar26 = vmulsd_avx512f(auVar26,auVar31);
  auVar39 = vmulsd_avx512f(auVar48,ZEXT816(0x3f91111111111111));
  auVar70._8_8_ = 0;
  auVar70._0_8_ = dVar49;
  auVar39 = vfmadd231sd_avx512f(auVar39,auVar70,ZEXT816(0x3f81111111111111));
  auVar40 = vfmadd231sd_avx512f(auVar26,auVar31,auVar16);
  auVar114._8_8_ = 0;
  auVar114._0_8_ = dVar53;
  auVar16 = vaddsd_avx512f(auVar39,ZEXT816(0x3f83813813813814));
  auVar26 = vmovddup_avx512vl(auVar14);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = dVar65 * dVar2 * (auVar15._0_8_ + 0.03333333333333333);
  auVar15 = vmulsd_avx512f(auVar31,auVar71);
  auVar41 = vmulsd_avx512f(auVar106,auVar16);
  auVar41 = vfmadd231sd_avx512f(auVar17,auVar31,auVar41);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = auVar27._0_8_;
  auVar16 = vmulsd_avx512f(auVar16,auVar17);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dVar68 * dVar59 * auVar18._0_8_;
  auVar18 = vfmadd231sd_fma(auVar45,auVar31,auVar16);
  dVar65 = peVar5->Jyz;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = dVar65;
  auVar16 = vaddsd_avx512f(auVar39,ZEXT816(0x3f7d41d41d41d41d));
  auVar16 = vmulsd_avx512f(auVar98,auVar16);
  auVar27 = vfmadd231sd_avx512f(auVar15,auVar31,auVar16);
  auVar31 = vdivsd_avx512f(auVar20,ZEXT816(0x4018000000000000));
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar53 * 6.0;
  auVar39 = vdivsd_avx512f(auVar39,auVar10);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar60 * 6.0;
  auVar42 = vdivsd_avx512f(auVar42,auVar10);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar65 * -6.0;
  auVar43 = vdivsd_avx512f(auVar43,auVar10);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar2 * peVar5->Jxx;
  auVar44 = vdivsd_avx512f(auVar44,ZEXT816(0x4018000000000000));
  auVar15 = ZEXT816(0x3fb5555555555555);
  auVar16 = vfmadd213sd_fma(ZEXT816(0x3fd5555555555555),auVar48,auVar15);
  auVar45 = vfmadd213sd_avx512f(ZEXT816(0x3fd5555555555555),auVar111,auVar15);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = dVar3 * 0.08333333333333333;
  auVar15 = vfmadd231sd_fma(auVar67,auVar48,auVar15);
  auVar17 = vmulsd_avx512f(auVar48,ZEXT816(0x3fd5555555555555));
  auVar17 = vfmadd213sd_fma(auVar17,auVar111,auVar15);
  auVar46._8_8_ = 0x3fa5555555555555;
  auVar46._0_8_ = 0x3fa5555555555555;
  auVar10 = vfnmadd231sd_fma(auVar15,auVar111,auVar36);
  auVar20._8_8_ = 0x3fa1111111111111;
  auVar20._0_8_ = 0x3fa1111111111111;
  auVar15 = vfmadd213pd_avx512vl(auVar46,auVar48,auVar20);
  auVar77._0_8_ = auVar26._0_8_ * auVar15._0_8_;
  auVar77._8_8_ = auVar26._8_8_ * auVar15._8_8_;
  auVar20 = vfmadd213sd_avx512f(auVar72,auVar111,ZEXT816(0x3fa999999999999a));
  auVar15 = vfmadd213sd_fma(auVar72,auVar48,ZEXT816(0x3fa999999999999a));
  auVar26._8_8_ = extraout_XMM0_Qb_00;
  auVar26._0_8_ = dVar55;
  auVar20 = vmulsd_avx512f(auVar14,auVar20);
  auVar14 = vmulsd_avx512f(auVar14,auVar15);
  auVar15._0_8_ = peVar5->Qy;
  auVar15._8_8_ = peVar5->Qz;
  auVar36 = vmulsd_avx512f(auVar103,auVar45);
  auVar45 = vmovddup_avx512vl(ZEXT816(0x8000000000000000));
  auVar46 = vmulsd_avx512f(auVar21,auVar24);
  dVar52 = auVar46._0_8_;
  dVar6 = dVar52 * dVar65 * dVar2 * (auVar10._0_8_ + 0.03333333333333333);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0] =
       auVar11._0_8_ / 3.0;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = auVar34._0_8_;
  auVar10 = vmulsd_avx512f(auVar21,auVar10);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0xc]
       = auVar10._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x18]
       = dVar63 * auVar33._0_8_;
  auVar10 = vmulsd_avx512f(auVar69,auVar36);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x24]
       = 0.0;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x30]
       = dVar63 * auVar10._0_8_;
  auVar10 = vxorpd_avx512vl(auVar103,auVar45);
  dVar7 = auVar16._0_8_ * auVar10._0_8_;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = dVar55 * dVar7;
  auVar16 = vmulsd_avx512f(auVar21,auVar91);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x3c]
       = auVar16._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x48]
       = auVar31._0_8_;
  auVar16 = vmulsd_avx512f(auVar39,auVar46);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x6c]
       = 0.0;
  pdVar1 = (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.
           array + 0xd;
  vmovsd_avx512f(auVar32);
  *pdVar1 = *pdVar1;
  auVar11 = vmulsd_avx512f(auVar43,auVar46);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x19]
       = auVar16._0_8_;
  auVar16 = vmulsd_avx512f(auVar114,auVar13);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x31]
       = auVar16._0_8_ * dVar52;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x3d]
       = auVar37._0_8_;
  auVar16 = vmulsd_avx512f(auVar107,auVar13);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x55]
       = auVar47._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x61]
       = auVar11._0_8_;
  dVar3 = auVar16._0_8_ * dVar52;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x79]
       = dVar3;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = dVar3;
  auVar47 = vxorpd_avx512vl(auVar72,auVar45);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x1a]
       = auVar22._0_8_;
  auVar16 = vxorpd_avx512vl(auVar45,auVar64);
  dVar3 = (double)vmovlpd_avx(auVar16);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x32]
       = dVar3;
  auVar16 = vxorpd_avx512vl(auVar35,auVar45);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x3e]
       = dVar53 * auVar16._0_8_ * dVar52;
  auVar16 = vshufpd_avx512vl(auVar15,auVar15,1);
  auVar22._8_8_ = 0x3fe0000000000000;
  auVar22._0_8_ = 0x3fe0000000000000;
  auVar16 = vmulpd_avx512vl(auVar16,auVar22);
  auVar22 = vmulpd_avx512vl(auVar16,auVar21);
  auVar16 = vxorpd_avx512vl(auVar22,auVar45);
  dVar3 = (double)vmovlpd_avx(auVar16);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x54]
       = dVar3;
  auVar16 = vshufpd_avx(auVar22,auVar22,1);
  auVar16 = vxorpd_avx512vl(auVar16,auVar45);
  dVar3 = (double)vmovlpd_avx(auVar16);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x60]
       = dVar3;
  *(undefined1 (*) [16])
   ((M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array +
   0x49) = auVar22;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x56]
       = auVar11._0_8_;
  auVar105._8_8_ = 0x3fc5555555555555;
  auVar105._0_8_ = 0x3fc5555555555555;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x62]
       = auVar8._0_8_;
  auVar16 = vmulsd_avx512f(auVar107,auVar35);
  auVar108._8_8_ = 0x3fc3333333333333;
  auVar108._0_8_ = 0x3fc3333333333333;
  dVar49 = auVar16._0_8_ * dVar52;
  auVar16 = vunpcklpd_avx(auVar10,auVar103);
  dVar51 = (auVar17._0_8_ + 0.13333333333333333) * auVar10._0_8_;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = dVar49;
  auVar17 = vunpcklpd_avx512vl(auVar40,auVar101);
  auVar10 = vxorpd_avx512vl(auVar17,auVar45);
  auVar17 = vfmadd231pd_fma(auVar108,auVar48,auVar105);
  auVar8._8_8_ = 0xbfb5555555555555;
  auVar8._0_8_ = 0xbfb5555555555555;
  auVar22 = vfmadd213pd_avx512vl(auVar105,auVar48,auVar8);
  dVar65 = auVar16._0_8_;
  auVar109._0_8_ = auVar17._0_8_ * dVar65;
  dVar68 = auVar16._8_8_;
  auVar109._8_8_ = auVar17._8_8_ * dVar68;
  auVar16 = vmulpd_avx512vl(auVar15,auVar109);
  auVar17 = vmulpd_avx512vl(auVar21,auVar16);
  *(undefined1 (*) [16])
   ((M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array +
   0x6d) = auVar17;
  pdVar1 = (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.
           array + 0x7a;
  vmovsd_avx512f(auVar25);
  *pdVar1 = *pdVar1;
  *(undefined1 (*) [16])
   ((M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array +
   0x85) = auVar10;
  auVar16 = vunpcklpd_avx(auVar17,auVar47);
  auVar115._8_8_ = 0;
  auVar115._0_8_ = dVar2 * dVar50;
  auVar10 = vdivsd_avx512f(auVar115,ZEXT816(0x4008000000000000));
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x27]
       = auVar10._0_8_;
  auVar10 = vxorpd_avx512vl(auVar20,auVar45);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x33]
       = dVar55 * auVar10._0_8_ * dVar63;
  auVar10 = vxorpd_avx512vl(auVar14,auVar45);
  auVar10 = vmulsd_avx512f(auVar69,auVar10);
  auVar10 = vmulsd_avx512f(auVar21,auVar10);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x3f]
       = auVar10._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x4b]
       = 0.0;
  *(undefined1 (*) [16])
   ((M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array +
   0x57) = auVar16;
  auVar16 = vxorpd_avx512vl(auVar25,auVar45);
  auVar16 = vshufpd_avx(auVar17,auVar16,1);
  auVar25._8_8_ = extraout_XMM0_Qb_02;
  auVar25._0_8_ = dVar62;
  *(undefined1 (*) [16])
   ((M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array +
   99) = auVar16;
  auVar16 = vmulpd_avx512vl(auVar15,auVar77);
  auVar17 = vxorpd_avx512vl(auVar45,auVar19);
  pdVar1 = (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.
           array + 0x6f;
  vmovsd_avx512f(auVar44);
  *pdVar1 = *pdVar1;
  auVar10 = vmulpd_avx512vl(auVar21,auVar16);
  auVar16 = vshufpd_avx(auVar10,auVar17,1);
  *(undefined1 (*) [16])
   ((M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array +
   0x7b) = auVar16;
  dVar3 = (double)vmovlpd_avx(auVar10);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x87]
       = dVar3;
  auVar16 = vshufpd_avx(auVar10,auVar10,1);
  auVar17 = vxorpd_avx512vl(auVar16,auVar45);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x34]
       = auVar30._0_8_;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = dVar51;
  auVar16 = vmulsd_avx512f(auVar114,auVar64);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x40]
       = dVar52 * auVar16._0_8_;
  auVar78._0_8_ = auVar22._0_8_ * dVar65;
  auVar78._8_8_ = auVar22._8_8_ * dVar68;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x88]
       = dVar6;
  pdVar1 = (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.
           array + 0x41;
  vmovsd_avx512f(auVar41);
  *pdVar1 = *pdVar1;
  auVar16 = vshufpd_avx(auVar78,auVar78,1);
  auVar15 = vmulpd_avx512vl(auVar15,auVar16);
  auVar79._0_8_ = dVar63 * auVar15._0_8_;
  auVar79._8_8_ = auVar24._8_8_ * auVar15._8_8_;
  dVar3 = (double)vmovlpd_avx(auVar79);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x78]
       = dVar3;
  dVar3 = (double)vmovhpd_avx(auVar79);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x84]
       = dVar3;
  *(undefined1 (*) [16])
   ((M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array +
   0x4c) = auVar79;
  pdVar1 = (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.
           array + 0x59;
  vmovsd_avx512f(auVar40);
  *pdVar1 = *pdVar1;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x65]
       = dVar49;
  *(undefined1 (*) [16])
   ((M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array +
   0x70) = auVar17;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x7d]
       = dVar6;
  auVar15 = vxorpd_avx512vl(auVar27,auVar45);
  auVar19._8_8_ = extraout_XMM0_Qb_01;
  auVar19._0_8_ = dVar61;
  auVar16 = vmulsd_avx512f(auVar25,auVar20);
  dVar3 = (double)vmovlpd_avx(auVar15);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x89]
       = dVar3;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = auVar12._0_8_;
  auVar15 = vdivsd_avx512f(auVar11,ZEXT816(0x4008000000000000));
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x4e]
       = auVar15._0_8_;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = dVar62 * -0.5;
  auVar15 = vmulsd_avx512f(auVar73,auVar21);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x5a]
       = auVar15._0_8_;
  auVar15 = vmulsd_avx512f(auVar19,auVar36);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x66]
       = dVar61 * -0.5 * dVar63;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x72]
       = 0.0;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = dVar60;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar62 * dVar7;
  auVar17 = vmulsd_avx512f(auVar21,auVar12);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x7e]
       = dVar63 * auVar15._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8a]
       = auVar17._0_8_;
  auVar15 = vunpcklpd_avx512vl(auVar69,auVar26);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x5b]
       = auVar28._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x67]
       = dVar52 * auVar42._0_8_;
  auVar17 = vxorpd_avx512vl(auVar13,auVar45);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x7f]
       = dVar60 * auVar17._0_8_ * dVar52;
  auVar17 = vxorpd_avx512vl(auVar45,auVar38);
  dVar3 = (double)vmovlpd_avx(auVar17);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8b]
       = dVar3;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x68]
       = auVar23._0_8_;
  auVar13._8_8_ = 0x3fd5555555555555;
  auVar13._0_8_ = 0x3fd5555555555555;
  auVar23._8_8_ = 0x3fd6666666666666;
  auVar23._0_8_ = 0x3fd6666666666666;
  auVar48 = vfmadd213pd_avx512vl(auVar13,auVar48,auVar23);
  dVar65 = auVar48._0_8_ * dVar65;
  dVar68 = auVar48._8_8_ * dVar68;
  auVar48 = vunpcklpd_avx(auVar19,auVar25);
  auVar74._0_8_ = auVar15._0_8_ * dVar65;
  auVar74._8_8_ = auVar15._8_8_ * dVar68;
  auVar24._0_8_ = auVar48._0_8_ * dVar65;
  auVar24._8_8_ = auVar48._8_8_ * dVar68;
  auVar48 = vmulpd_avx512vl(auVar21,auVar74);
  auVar15 = vmulpd_avx512vl(auVar21,auVar24);
  *(undefined1 (*) [16])
   ((M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array +
   0x25) = auVar48;
  *(undefined1 (*) [16])
   ((M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array +
   0x73) = auVar15;
  auVar48 = vmulsd_avx512f(auVar19,auVar14);
  auVar48 = vmulsd_avx512f(auVar21,auVar48);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x80]
       = auVar66._0_8_;
  auVar15 = vmulsd_avx512f(auVar102,auVar35);
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8c]
       = auVar15._0_8_ * dVar52;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar2 * dVar57;
  auVar15 = vdivsd_avx512f(auVar14,ZEXT816(0x4008000000000000));
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x75]
       = auVar15._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x81]
       = dVar63 * auVar16._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8d]
       = auVar48._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x82]
       = auVar29._0_8_;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8e]
       = dVar52 * dVar60 * dVar51;
  (M->super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>_>).m_storage.m_data.array[0x8f]
       = auVar18._0_8_;
  for (; row = col, col != 0xc; col = col + 1) {
    for (; row != 0xc; row = row + 1) {
      pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_1> *)M,row,col)
      ;
      SVar4 = *pSVar9;
      pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_12,_12,_1,_12,_12>,_1> *)M,col,row)
      ;
      *pSVar9 = SVar4;
    }
  }
  return;
}

Assistant:

void ChBeamSectionTaperedTimoshenkoAdvancedGeneric::ComputeConsistentInertiaMatrix(ChMatrixNM<double, 12, 12>& M) {
    M.setZero();

    double mu1 = this->sectionA->GetMassPerUnitLength();
    double Jxx1 = this->sectionA->GetInertiaJxxPerUnitLength();
    double Jyy1 = this->sectionA->GetInertiaJyyPerUnitLength();
    double Jzz1 = this->sectionA->GetInertiaJzzPerUnitLength();
    double Jyz1 = this->sectionA->GetInertiaJyzPerUnitLength();
    double Qy1 = this->sectionA->GetInertiaQyPerUnitLength();
    double Qz1 = this->sectionA->GetInertiaQzPerUnitLength();

    double mu2 = this->sectionB->GetMassPerUnitLength();
    double Jxx2 = this->sectionB->GetInertiaJxxPerUnitLength();
    double Jyy2 = this->sectionB->GetInertiaJyyPerUnitLength();
    double Jzz2 = this->sectionB->GetInertiaJzzPerUnitLength();
    double Jyz2 = this->sectionB->GetInertiaJyzPerUnitLength();
    double Qy2 = this->sectionB->GetInertiaQyPerUnitLength();
    double Qz2 = this->sectionB->GetInertiaQzPerUnitLength();

    double L = this->GetLength();
    double LL = L * L;
    double LLL = LL * L;
    double mu = this->avg_sec_par->mu;
    double Jyy = this->avg_sec_par->Jyy;
    double Jzz = this->avg_sec_par->Jzz;
    double Jyz = this->avg_sec_par->Jyz;
    double Jxx = this->avg_sec_par->Jxx;
    double Qy = this->avg_sec_par->Qy;
    double Qz = this->avg_sec_par->Qz;
    double phiy = this->avg_sec_par->phimy;
    double phiz = this->avg_sec_par->phimz;

    double phiy2 = phiy * phiy;
    double phiz2 = phiz * phiz;
    double oneplusphiy = 1.0 / (phiy + 1.);
    double oneplusphiz = 1.0 / (phiz + 1.);
    double oneplusphiy2 = oneplusphiy * oneplusphiy;
    double oneplusphiz2 = oneplusphiz * oneplusphiz;
    double oneplusphiyz = oneplusphiy * oneplusphiz;

    double rAy1 =
        6. * Jyy1 / (5. * L) * oneplusphiz2 + mu1 * L * (1. / 3. * phiz2 + 7. / 10. * phiz + 13. / 35.) * oneplusphiz2;
    double rAz1 =
        6. * Jzz1 / (5. * L) * oneplusphiy2 + mu1 * L * (1. / 3. * phiy2 + 7. / 10. * phiy + 13. / 35.) * oneplusphiy2;
    double rAy2 =
        6. * Jyy2 / (5. * L) * oneplusphiz2 + mu2 * L * (1. / 3. * phiz2 + 7. / 10. * phiz + 13. / 35.) * oneplusphiz2;
    double rAz2 =
        6. * Jzz2 / (5. * L) * oneplusphiy2 + mu2 * L * (1. / 3. * phiy2 + 7. / 10. * phiy + 13. / 35.) * oneplusphiy2;
    // double rAy =
    // 6. * Jyy / (5. * L) * oneplusphiz2 + mu * L * (1. / 3. * phiz2 + 7. / 10. * phiz + 13. / 35.) * oneplusphiz2;
    // double rAz =
    // 6. * Jzz / (5. * L) * oneplusphiy2 + mu * L * (1. / 3. * phiy2 + 7. / 10. * phiy + 13. / 35.) * oneplusphiy2;

    double rBy =
        (mu * L * (1. / 6. * phiz2 + 3. / 10. * phiz + 9. / 70.)) * oneplusphiz2 - 6. * Jyy / (5. * L) * oneplusphiz2;
    double rBz =
        (mu * L * (1. / 6. * phiy2 + 3. / 10. * phiy + 9. / 70.)) * oneplusphiy2 - 6. * Jzz / (5. * L) * oneplusphiy2;

    double rCy1 = (mu1 * LL * (1. / 24. * phiz2 + 11. / 120. * phiz + 11. / 210.)) * oneplusphiz2 -
                  (1. / 2. * phiz - 1. / 10.) * Jyy1 * oneplusphiz2;
    double rCz1 = (mu1 * LL * (1. / 24. * phiy2 + 11. / 120. * phiy + 11. / 210.)) * oneplusphiy2 -
                  (1. / 2. * phiy - 1. / 10.) * Jzz1 * oneplusphiy2;
    double rCy2 = (mu2 * LL * (1. / 24. * phiz2 + 11. / 120. * phiz + 11. / 210.)) * oneplusphiz2 -
                  (1. / 2. * phiz - 1. / 10.) * Jyy2 * oneplusphiz2;
    double rCz2 = (mu2 * LL * (1. / 24. * phiy2 + 11. / 120. * phiy + 11. / 210.)) * oneplusphiy2 -
                  (1. / 2. * phiy - 1. / 10.) * Jzz2 * oneplusphiy2;
    // double rCy = (mu * LL * (1. / 24. * phiz2 + 11. / 120. * phiz + 11. / 210.)) * oneplusphiz2 -
    //(1. / 2. * phiz - 1. / 10.) * Jyy * oneplusphiz2;
    // double rCz = (mu * LL * (1. / 24. * phiy2 + 11. / 120. * phiy + 11. / 210.)) * oneplusphiy2 -
    //(1. / 2. * phiy - 1. / 10.) * Jzz * oneplusphiy2;

    double rDy = (mu * LL * (1. / 24. * phiz2 + 3. / 40. * phiz + 13. / 420.)) * oneplusphiz2 +
                 (1. / 2. * phiz - 1. / 10.) * Jyy * oneplusphiz2;
    double rDz = (mu * LL * (1. / 24. * phiy2 + 3. / 40. * phiy + 13. / 420.)) * oneplusphiy2 +
                 (1. / 2. * phiy - 1. / 10.) * Jzz * oneplusphiy2;

    double rEy1 = mu1 * LLL * (1. / 120. * phiz2 + 1. / 60. * phiz + 1. / 105.) * oneplusphiz2 +
                  L * (1. / 3. * phiz2 + 1. / 6. * phiz + 2. / 15.) * Jyy1 * oneplusphiz2;
    double rEz1 = mu1 * LLL * (1. / 120. * phiy2 + 1. / 60. * phiy + 1. / 105.) * oneplusphiy2 +
                  L * (1. / 3. * phiy2 + 1. / 6. * phiy + 2. / 15.) * Jzz1 * oneplusphiy2;
    double rEy2 = mu2 * LLL * (1. / 120. * phiz2 + 1. / 60. * phiz + 1. / 105.) * oneplusphiz2 +
                  L * (1. / 3. * phiz2 + 1. / 6. * phiz + 2. / 15.) * Jyy2 * oneplusphiz2;
    double rEz2 = mu2 * LLL * (1. / 120. * phiy2 + 1. / 60. * phiy + 1. / 105.) * oneplusphiy2 +
                  L * (1. / 3. * phiy2 + 1. / 6. * phiy + 2. / 15.) * Jzz2 * oneplusphiy2;
    // double rEy = mu * LLL * (1. / 120. * phiz2 + 1. / 60. * phiz + 1. / 105.) * oneplusphiz2 +
    // L * (1. / 3. * phiz2 + 1. / 6. * phiz + 2. / 15.) * Jyy * oneplusphiz2;
    // double rEz = mu * LLL * (1. / 120. * phiy2 + 1. / 60. * phiy + 1. / 105.) * oneplusphiy2 +
    // L * (1. / 3. * phiy2 + 1. / 6. * phiy + 2. / 15.) * Jzz * oneplusphiy2;

    double rFy = (mu * LLL * (1. / 120. * phiz2 + 1. / 60. * phiz + 1. / 140.)) * oneplusphiz2 +
                 L * (-1. / 6. * phiz2 + 1. / 6. * phiz + 1. / 30.) * Jyy * oneplusphiz2;
    double rFz = (mu * LLL * (1. / 120. * phiy2 + 1. / 60. * phiy + 1. / 140.)) * oneplusphiy2 +
                 L * (-1. / 6. * phiy2 + 1. / 6. * phiy + 1. / 30.) * Jzz * oneplusphiy2;

    double rGy1 = Qy1 / 2. * oneplusphiz;
    double rGz1 = Qz1 / 2. * oneplusphiy;
    double rGy2 = Qy2 / 2. * oneplusphiz;
    double rGz2 = Qz2 / 2. * oneplusphiy;
    double rGy = Qy / 2. * oneplusphiz;
    double rGz = Qz / 2. * oneplusphiy;

    double rHy1 = L * (1. / 3. * phiy + 1. / 12.) * Qz1 * oneplusphiy;
    double rHz1 = L * (1. / 3. * phiz + 1. / 12.) * Qy1 * oneplusphiz;
    double rHy2 = L * (1. / 3. * phiy + 1. / 12.) * Qz2 * oneplusphiy;
    double rHz2 = L * (1. / 3. * phiz + 1. / 12.) * Qy2 * oneplusphiz;
    // double rHy = L * (1. / 3. * phiy + 1. / 12.) * Qz * oneplusphiy;
    // double rHz = L * (1. / 3. * phiz + 1. / 12.) * Qy * oneplusphiz;

    double rIy = L * (1. / 6. * phiy - 1. / 12.) * Qz * oneplusphiy;
    double rIz = L * (1. / 6. * phiz - 1. / 12.) * Qy * oneplusphiz;

    double rJyz1 = 6. * Jyz1 / (5. * L) * oneplusphiyz;
    double rJyz2 = 6. * Jyz2 / (5. * L) * oneplusphiyz;
    double rJyz = 6. * Jyz / (5. * L) * oneplusphiyz;

    double rKy = L * (1. / 6. * phiy + 3. / 20.) * Qy * oneplusphiy;
    double rKz = L * (1. / 6. * phiz + 3. / 20.) * Qz * oneplusphiz;

    double rLy1 = L * (1. / 3. * phiy + 7. / 20.) * Qy1 * oneplusphiy;
    double rLz1 = L * (1. / 3. * phiz + 7. / 20.) * Qz1 * oneplusphiz;
    double rLy2 = L * (1. / 3. * phiy + 7. / 20.) * Qy2 * oneplusphiy;
    double rLz2 = L * (1. / 3. * phiz + 7. / 20.) * Qz2 * oneplusphiz;
    // double rLy = L * (1. / 3. * phiy + 7. / 20.) * Qy * oneplusphiy;
    // double rLz = L * (1. / 3. * phiz + 7. / 20.) * Qz * oneplusphiz;

    double rMy1 = (1. / 2. * phiy - 1. / 10.) * Jyz1 * oneplusphiyz;
    double rMz1 = (1. / 2. * phiz - 1. / 10.) * Jyz1 * oneplusphiyz;
    double rMy2 = (1. / 2. * phiy - 1. / 10.) * Jyz2 * oneplusphiyz;
    double rMz2 = (1. / 2. * phiz - 1. / 10.) * Jyz2 * oneplusphiyz;
    double rMy = (1. / 2. * phiy - 1. / 10.) * Jyz * oneplusphiyz;
    double rMz = (1. / 2. * phiz - 1. / 10.) * Jyz * oneplusphiyz;

    double rNyz1 = L * (1. / 12. * phiy + 1. / 12. * phiz + 1. / 3. * phiy * phiz + 2. / 15.) * Jyz1 * oneplusphiyz;
    double rNyz2 = L * (1. / 12. * phiy + 1. / 12. * phiz + 1. / 3. * phiy * phiz + 2. / 15.) * Jyz2 * oneplusphiyz;
    // double rNyz = L * (1. / 12. * phiy + 1. / 12. * phiz + 1. / 3. * phiy * phiz + 2. / 15.) * Jyz * oneplusphiyz;

    double rOyz = L * (1. / 12. * phiy + 1. / 12. * phiz - 1. / 6. * phiy * phiz + 1. / 30.) * Jyz * oneplusphiyz;
    double rPy = LL * (1. / 24. * phiy + 1. / 30.) * Qy * oneplusphiy;
    double rPz = LL * (1. / 24. * phiz + 1. / 30.) * Qz * oneplusphiz;

    double rQy1 = LL * (1. / 24. * phiy + 1. / 20.) * Qy1 * oneplusphiy;
    double rQz1 = LL * (1. / 24. * phiz + 1. / 20.) * Qz1 * oneplusphiz;
    double rQy2 = LL * (1. / 24. * phiy + 1. / 20.) * Qy2 * oneplusphiy;
    double rQz2 = LL * (1. / 24. * phiz + 1. / 20.) * Qz2 * oneplusphiz;
    // double rQy = LL * (1. / 24. * phiy + 1. / 20.) * Qy * oneplusphiy;
    // double rQz = LL * (1. / 24. * phiz + 1. / 20.) * Qz * oneplusphiz;

    M(0, 0) = mu1 * L / 3.;
    M(1, 0) = rGz1;
    M(2, 0) = rGy1;
    M(3, 0) = 0.;
    M(4, 0) = rHz1;
    M(5, 0) = -rHy1;

    M(6, 0) = mu * L / 6.;
    M(7, 0) = -rGz;
    M(8, 0) = -rGy;
    M(9, 0) = 0.;
    M(10, 0) = rIz;
    M(11, 0) = -rIy;

    M(1, 1) = rAz1;
    M(2, 1) = rJyz1;
    M(3, 1) = -rLy1;
    M(4, 1) = rMz1;
    M(5, 1) = rCz1;

    M(6, 1) = rGz;
    M(7, 1) = rBz;
    M(8, 1) = -rJyz;
    M(9, 1) = -rKy;
    M(10, 1) = rMz;
    M(11, 1) = -rDz;

    M(2, 2) = rAy1;
    M(3, 2) = rLz1;
    M(4, 2) = -rCy1;
    M(5, 2) = -rMy1;

    M(6, 2) = rGy;
    M(7, 2) = -rJyz;
    M(8, 2) = rBy;
    M(9, 2) = rKz;
    M(10, 2) = rDy;
    M(11, 2) = -rMy;

    M(3, 3) = L * Jxx1 / 3.;
    M(4, 3) = -rQz1;
    M(5, 3) = -rQy1;

    M(6, 3) = 0.;
    M(7, 3) = -rKy;
    M(8, 3) = rKz;
    M(9, 3) = L * Jxx / 6.;
    M(10, 3) = rPz;
    M(11, 3) = rPy;

    M(4, 4) = rEy1;
    M(5, 4) = -rNyz1;

    M(6, 4) = rIz;
    M(7, 4) = -rMz;
    M(8, 4) = -rDy;
    M(9, 4) = -rPz;
    M(10, 4) = -rFy;
    M(11, 4) = rOyz;

    M(5, 5) = rEz1;

    M(6, 5) = -rIy;
    M(7, 5) = rDz;
    M(8, 5) = rMy;
    M(9, 5) = -rPy;
    M(10, 5) = rOyz;
    M(11, 5) = -rFz;

    M(6, 6) = mu2 * L / 3.;
    M(7, 6) = -rGz2;
    M(8, 6) = -rGy2;
    M(9, 6) = 0.;
    M(10, 6) = rHz2;
    M(11, 6) = -rHy2;
    M(7, 7) = rAz2;
    M(8, 7) = rJyz2;
    M(9, 7) = -rLy2;
    M(10, 7) = -rMz2;
    M(11, 7) = -rCz2;
    M(8, 8) = rAy2;
    M(9, 8) = rLz2;
    M(10, 8) = rCy2;
    M(11, 8) = rMy2;
    M(9, 9) = L * Jxx2 / 3.;
    M(10, 9) = rQz2;
    M(11, 9) = rQy2;
    M(10, 10) = rEy2;
    M(11, 10) = -rNyz2;
    M(11, 11) = rEz2;

    // obtain the symmetric right-top elements by mirror
    for (int i = 0; i < 12; i++) {
        for (int j = i; j < 12; j++) {
            M(i, j) = M(j, i);
        }
    }
}